

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O2

bool slang::ast::builtins::ArrayQueryFunction::checkDim
               (ASTContext *context,Args *args,int32_t *resultIndex)

{
  bool bVar1;
  bool bVar2;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *this;
  optional<int> oVar3;
  Type *this_00;
  Diagnostic *pDVar4;
  _Storage<int,_true> _Var5;
  _Storage<int,_true> _Var6;
  anon_class_24_3_8c0f11e8 error;
  ConstantValue iv;
  anon_class_24_3_8c0f11e8 local_68;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_50;
  
  ASTContext::tryEval((ConstantValue *)&local_50,context,args->_M_ptr[1]);
  if (local_50._M_index == '\0') {
    bVar1 = true;
  }
  else {
    local_68.context = context;
    local_68.args = args;
    local_68.iv = (ConstantValue *)&local_50;
    this = std::
           get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                     ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       *)&local_50);
    oVar3 = SVInt::as<int>(this);
    _Var6._M_value =
         oVar3.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
         _M_payload;
    if ((oVar3.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
         _M_engaged & 0 < _Var6._M_value) == 0) {
      bVar1 = checkDim::anon_class_24_3_8c0f11e8::operator()(&local_68);
    }
    else {
      *resultIndex = (int32_t)_Var6;
      this_00 = ((*args->_M_ptr)->type).ptr;
      _Var5._M_value = _Var6._M_value;
      while (_Var5._M_value = _Var5._M_value + -1, _Var5._M_value != 0) {
        bVar1 = Type::isArray(this_00);
        if (!bVar1) {
          bVar1 = checkDim::anon_class_24_3_8c0f11e8::operator()(&local_68);
          goto LAB_0041c1a0;
        }
        this_00 = Type::getArrayElementType(this_00);
      }
      bVar1 = Type::hasFixedRange(this_00);
      if (bVar1) {
        bVar2 = Type::isScalar(this_00);
        bVar1 = true;
        if (!bVar2) goto LAB_0041c1a0;
      }
      bVar1 = Type::isString(this_00);
      if ((bVar1) || (bVar1 = Type::isUnpackedArray(this_00), bVar1)) {
        bVar1 = true;
        if (_Var6._M_value != 1) {
          pDVar4 = ASTContext::addDiag(context,(DiagCode)0x7000b,(*args->_M_ptr)->sourceRange);
          pDVar4 = Diagnostic::operator<<(pDVar4,(ConstantValue *)&local_50);
          Diagnostic::operator<<(pDVar4,args->_M_ptr[1]->sourceRange);
          bVar1 = false;
        }
      }
      else {
        bVar1 = checkDim::anon_class_24_3_8c0f11e8::operator()(&local_68);
      }
    }
  }
LAB_0041c1a0:
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&local_50);
  return bVar1;
}

Assistant:

static bool checkDim(const ASTContext& context, const Args& args, int32_t& resultIndex) {
        // Similar logic to what's above, except we're just verifying a constant index here.
        // It's ok for it not to be constant, it will be evaluated at runtime.
        ConstantValue iv = context.tryEval(*args[1]);
        if (!iv)
            return true;

        auto error = [&] {
            context.addDiag(diag::DimensionIndexInvalid, args[1]->sourceRange)
                << iv << *args[0]->type;
            return false;
        };

        std::optional<int32_t> index = iv.integer().as<int32_t>();
        if (!index || *index <= 0)
            return error();

        resultIndex = *index;
        const Type* type = args[0]->type;
        for (int32_t i = 0; i < *index - 1; i++) {
            if (!type->isArray())
                return error();
            type = type->getArrayElementType();
        }

        if (type->hasFixedRange() && !type->isScalar())
            return true;

        if (!type->isString() && !type->isUnpackedArray())
            return error();

        if (*index != 1) {
            context.addDiag(diag::DynamicDimensionIndex, args[0]->sourceRange)
                << iv << args[1]->sourceRange;
            return false;
        }

        return true;
    }